

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void LTFlightDataStop(void)

{
  curl_global_cleanup();
  return;
}

Assistant:

void LTFlightDataStop()
{
    /// @see https://github.com/Homebrew/homebrew-core/issues/158759#issuecomment-1874091015
    /// To be able to reload plugins we don't properly call global cleanup
#if APL==0
    // cleanup global CURL stuff
    curl_global_cleanup();
#endif
}